

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_tls.cc
# Opt level: O0

int aead_tls_open(EVP_AEAD_CTX *ctx,uint8_t *out,size_t *out_len,size_t max_out_len,uint8_t *nonce,
                 size_t nonce_len,uint8_t *in,size_t in_len,uint8_t *ad,size_t ad_len)

{
  ulong in_len_00;
  AEAD_TLS_CTX *pAVar1;
  size_t *in_00;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  AEAD_TLS_CTX *pAVar6;
  size_t sVar7;
  crypto_word_t cVar8;
  crypto_word_t good;
  uint8_t **ppuStack_120;
  uint mac_len_u;
  uint8_t *record_mac;
  uint8_t record_mac_tmp [64];
  size_t local_d0;
  size_t mac_len;
  uint8_t mac [64];
  uint8_t local_7d [8];
  uint8_t ad_fixed [13];
  size_t data_len;
  crypto_word_t padding_ok;
  size_t data_plus_mac_len;
  size_t sStack_50;
  int len;
  size_t total;
  AEAD_TLS_CTX *tls_ctx;
  size_t nonce_len_local;
  uint8_t *nonce_local;
  size_t max_out_len_local;
  size_t *out_len_local;
  uint8_t *out_local;
  EVP_AEAD_CTX *ctx_local;
  
  total = (size_t)&ctx->state;
  tls_ctx = (AEAD_TLS_CTX *)nonce_len;
  nonce_len_local = (size_t)nonce;
  nonce_local = (uint8_t *)max_out_len;
  max_out_len_local = (size_t)out_len;
  out_len_local = (size_t *)out;
  out_local = (uint8_t *)ctx;
  if (*(int *)((long)&ctx->state + 0x1c) == 0) {
    sVar5 = HMAC_size((HMAC_CTX *)((long)&ctx->state + 0x98));
    pAVar1 = tls_ctx;
    if (in_len < sVar5) {
      ERR_put_error(0x1e,0,0x65,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                    ,0xf9);
      ctx_local._4_4_ = 0;
    }
    else if (nonce_local < in_len) {
      ERR_put_error(0x1e,0,0x67,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                    ,0x100);
      ctx_local._4_4_ = 0;
    }
    else {
      pAVar6 = (AEAD_TLS_CTX *)EVP_AEAD_nonce_length(*(EVP_AEAD **)out_local);
      if (pAVar1 == pAVar6) {
        if (ad_len == 0xb) {
          if (in_len < 0x80000000) {
            uVar2 = EVP_CIPHER_CTX_mode((EVP_CIPHER_CTX *)total);
            if (((uVar2 == 2) && (*(char *)(total + 0x141) == '\0')) &&
               (iVar3 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)total,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                                           (uchar *)0x0,(uchar *)nonce_len_local), iVar3 == 0)) {
              ctx_local._4_4_ = 0;
            }
            else {
              sStack_50 = 0;
              iVar3 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)total,(uchar *)out_len_local,
                                        (int *)((long)&data_plus_mac_len + 4),in,(int)in_len);
              if (iVar3 == 0) {
                ctx_local._4_4_ = 0;
              }
              else {
                sStack_50 = (long)data_plus_mac_len._4_4_ + sStack_50;
                iVar3 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)total,
                                            (uchar *)((long)out_len_local + sStack_50),
                                            (int *)((long)&data_plus_mac_len + 4));
                if (iVar3 == 0) {
                  ctx_local._4_4_ = 0;
                }
                else {
                  sStack_50 = (long)data_plus_mac_len._4_4_ + sStack_50;
                  if (sStack_50 != in_len) {
                    __assert_fail("total == in_len",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                                  ,0x126,
                                  "int aead_tls_open(const EVP_AEAD_CTX *, uint8_t *, size_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t)"
                                 );
                  }
                  uVar2 = EVP_CIPHER_CTX_mode((EVP_CIPHER_CTX *)total);
                  in_00 = out_len_local;
                  in_len_00 = sStack_50;
                  if (uVar2 == 2) {
                    uVar4 = EVP_CIPHER_CTX_block_size((EVP_CIPHER_CTX *)total);
                    sVar5 = HMAC_size((HMAC_CTX *)(total + 0x98));
                    iVar3 = EVP_tls_cbc_remove_padding
                                      (&data_len,&padding_ok,(uint8_t *)in_00,in_len_00,(ulong)uVar4
                                       ,sVar5);
                    if (iVar3 == 0) {
                      ERR_put_error(0x1e,0,0x65,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                                    ,0x134);
                      return 0;
                    }
                  }
                  else {
                    data_len = 0xffffffffffffffff;
                    padding_ok = sStack_50;
                    sVar5 = HMAC_size((HMAC_CTX *)(total + 0x98));
                    if (in_len_00 < sVar5) {
                      __assert_fail("data_plus_mac_len >= HMAC_size(&tls_ctx->hmac_ctx)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                                    ,0x13c,
                                    "int aead_tls_open(const EVP_AEAD_CTX *, uint8_t *, size_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t)"
                                   );
                    }
                  }
                  cVar8 = padding_ok;
                  sVar5 = HMAC_size((HMAC_CTX *)(total + 0x98));
                  ad_fixed._5_8_ = cVar8 - sVar5;
                  OPENSSL_memcpy(local_7d,ad,0xb);
                  ad_fixed[3] = SUB81(ad_fixed._5_8_,1);
                  ad_fixed[4] = (uint8_t)ad_fixed._5_8_;
                  uVar2 = EVP_CIPHER_CTX_mode((EVP_CIPHER_CTX *)total);
                  if ((uVar2 == 2) &&
                     (iVar3 = EVP_tls_cbc_record_digest_supported(*(EVP_MD **)(total + 0x98)),
                     iVar3 != 0)) {
                    iVar3 = EVP_tls_cbc_digest_record
                                      (*(EVP_MD **)(total + 0x98),(uint8_t *)&mac_len,&local_d0,
                                       local_7d,(uint8_t *)out_len_local,ad_fixed._5_8_,sStack_50,
                                       (uint8_t *)(total + 0x100),(uint)*(byte *)(total + 0x140));
                    sVar5 = local_d0;
                    if (iVar3 == 0) {
                      ERR_put_error(0x1e,0,0x65,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                                    ,0x156);
                      return 0;
                    }
                    sVar7 = HMAC_size((HMAC_CTX *)(total + 0x98));
                    if (sVar5 != sVar7) {
                      __assert_fail("mac_len == HMAC_size(&tls_ctx->hmac_ctx)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                                    ,0x159,
                                    "int aead_tls_open(const EVP_AEAD_CTX *, uint8_t *, size_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t)"
                                   );
                    }
                    ppuStack_120 = &record_mac;
                    EVP_tls_cbc_copy_mac
                              ((uint8_t *)ppuStack_120,local_d0,(uint8_t *)out_len_local,padding_ok,
                               sStack_50);
                  }
                  else {
                    uVar2 = EVP_CIPHER_CTX_mode((EVP_CIPHER_CTX *)total);
                    if (uVar2 == 2) {
                      __assert_fail("EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) != EVP_CIPH_CBC_MODE"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                                    ,0x160,
                                    "int aead_tls_open(const EVP_AEAD_CTX *, uint8_t *, size_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t)"
                                   );
                    }
                    iVar3 = HMAC_Init_ex((HMAC_CTX *)(total + 0x98),(void *)0x0,0,(EVP_MD *)0x0,
                                         (ENGINE *)0x0);
                    if (((iVar3 == 0) ||
                        (iVar3 = HMAC_Update((HMAC_CTX *)(total + 0x98),local_7d,0xd), iVar3 == 0))
                       || ((iVar3 = HMAC_Update((HMAC_CTX *)(total + 0x98),(uchar *)out_len_local,
                                                ad_fixed._5_8_), iVar3 == 0 ||
                           (iVar3 = HMAC_Final((HMAC_CTX *)(total + 0x98),(uchar *)&mac_len,
                                               (uint *)((long)&good + 4)), iVar3 == 0)))) {
                      return 0;
                    }
                    local_d0 = (ulong)good._4_4_;
                    sVar5 = HMAC_size((HMAC_CTX *)(total + 0x98));
                    if (good._4_4_ != sVar5) {
                      __assert_fail("mac_len == HMAC_size(&tls_ctx->hmac_ctx)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                                    ,0x16b,
                                    "int aead_tls_open(const EVP_AEAD_CTX *, uint8_t *, size_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t)"
                                   );
                    }
                    ppuStack_120 = (uint8_t **)((long)out_len_local + ad_fixed._5_8_);
                  }
                  iVar3 = CRYPTO_memcmp(ppuStack_120,&mac_len,local_d0);
                  cVar8 = constant_time_eq_int(iVar3,0);
                  if ((data_len & cVar8) == 0) {
                    ERR_put_error(0x1e,0,0x65,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                                  ,0x178);
                    ctx_local._4_4_ = 0;
                  }
                  else {
                    *(undefined8 *)max_out_len_local = ad_fixed._5_8_;
                    ctx_local._4_4_ = 1;
                  }
                }
              }
            }
          }
          else {
            ERR_put_error(0x1e,0,0x75,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                          ,0x110);
            ctx_local._4_4_ = 0;
          }
        }
        else {
          ERR_put_error(0x1e,0,0x6d,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                        ,0x10a);
          ctx_local._4_4_ = 0;
        }
      }
      else {
        ERR_put_error(0x1e,0,0x6f,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                      ,0x105);
        ctx_local._4_4_ = 0;
      }
    }
  }
  else {
    ERR_put_error(0x1e,0,0x70,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                  ,0xf4);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int aead_tls_open(const EVP_AEAD_CTX *ctx, uint8_t *out, size_t *out_len,
                         size_t max_out_len, const uint8_t *nonce,
                         size_t nonce_len, const uint8_t *in, size_t in_len,
                         const uint8_t *ad, size_t ad_len) {
  AEAD_TLS_CTX *tls_ctx = (AEAD_TLS_CTX *)&ctx->state;

  if (tls_ctx->cipher_ctx.encrypt) {
    // Unlike a normal AEAD, a TLS AEAD may only be used in one direction.
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_INVALID_OPERATION);
    return 0;
  }

  if (in_len < HMAC_size(&tls_ctx->hmac_ctx)) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
    return 0;
  }

  if (max_out_len < in_len) {
    // This requires that the caller provide space for the MAC, even though it
    // will always be removed on return.
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BUFFER_TOO_SMALL);
    return 0;
  }

  if (nonce_len != EVP_AEAD_nonce_length(ctx->aead)) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_INVALID_NONCE_SIZE);
    return 0;
  }

  if (ad_len != 13 - 2 /* length bytes */) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_INVALID_AD_SIZE);
    return 0;
  }

  if (in_len > INT_MAX) {
    // EVP_CIPHER takes int as input.
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TOO_LARGE);
    return 0;
  }

  // Configure the explicit IV.
  if (EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) == EVP_CIPH_CBC_MODE &&
      !tls_ctx->implicit_iv &&
      !EVP_DecryptInit_ex(&tls_ctx->cipher_ctx, NULL, NULL, NULL, nonce)) {
    return 0;
  }

  // Decrypt to get the plaintext + MAC + padding.
  size_t total = 0;
  int len;
  if (!EVP_DecryptUpdate(&tls_ctx->cipher_ctx, out, &len, in, (int)in_len)) {
    return 0;
  }
  total += len;
  if (!EVP_DecryptFinal_ex(&tls_ctx->cipher_ctx, out + total, &len)) {
    return 0;
  }
  total += len;
  assert(total == in_len);

  CONSTTIME_SECRET(out, total);

  // Remove CBC padding. Code from here on is timing-sensitive with respect to
  // |padding_ok| and |data_plus_mac_len| for CBC ciphers.
  size_t data_plus_mac_len;
  crypto_word_t padding_ok;
  if (EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) == EVP_CIPH_CBC_MODE) {
    if (!EVP_tls_cbc_remove_padding(
            &padding_ok, &data_plus_mac_len, out, total,
            EVP_CIPHER_CTX_block_size(&tls_ctx->cipher_ctx),
            HMAC_size(&tls_ctx->hmac_ctx))) {
      // Publicly invalid. This can be rejected in non-constant time.
      OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
      return 0;
    }
  } else {
    padding_ok = CONSTTIME_TRUE_W;
    data_plus_mac_len = total;
    // |data_plus_mac_len| = |total| = |in_len| at this point. |in_len| has
    // already been checked against the MAC size at the top of the function.
    assert(data_plus_mac_len >= HMAC_size(&tls_ctx->hmac_ctx));
  }
  size_t data_len = data_plus_mac_len - HMAC_size(&tls_ctx->hmac_ctx);

  // At this point, if the padding is valid, the first |data_plus_mac_len| bytes
  // after |out| are the plaintext and MAC. Otherwise, |data_plus_mac_len| is
  // still large enough to extract a MAC, but it will be irrelevant.

  // To allow for CBC mode which changes cipher length, |ad| doesn't include the
  // length for legacy ciphers.
  uint8_t ad_fixed[13];
  OPENSSL_memcpy(ad_fixed, ad, 11);
  ad_fixed[11] = (uint8_t)(data_len >> 8);
  ad_fixed[12] = (uint8_t)(data_len & 0xff);
  ad_len += 2;

  // Compute the MAC and extract the one in the record.
  uint8_t mac[EVP_MAX_MD_SIZE];
  size_t mac_len;
  uint8_t record_mac_tmp[EVP_MAX_MD_SIZE];
  uint8_t *record_mac;
  if (EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) == EVP_CIPH_CBC_MODE &&
      EVP_tls_cbc_record_digest_supported(tls_ctx->hmac_ctx.md)) {
    if (!EVP_tls_cbc_digest_record(tls_ctx->hmac_ctx.md, mac, &mac_len,
                                   ad_fixed, out, data_len, total,
                                   tls_ctx->mac_key, tls_ctx->mac_key_len)) {
      OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
      return 0;
    }
    assert(mac_len == HMAC_size(&tls_ctx->hmac_ctx));

    record_mac = record_mac_tmp;
    EVP_tls_cbc_copy_mac(record_mac, mac_len, out, data_plus_mac_len, total);
  } else {
    // We should support the constant-time path for all CBC-mode ciphers
    // implemented.
    assert(EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) != EVP_CIPH_CBC_MODE);

    unsigned mac_len_u;
    if (!HMAC_Init_ex(&tls_ctx->hmac_ctx, NULL, 0, NULL, NULL) ||
        !HMAC_Update(&tls_ctx->hmac_ctx, ad_fixed, ad_len) ||
        !HMAC_Update(&tls_ctx->hmac_ctx, out, data_len) ||
        !HMAC_Final(&tls_ctx->hmac_ctx, mac, &mac_len_u)) {
      return 0;
    }
    mac_len = mac_len_u;

    assert(mac_len == HMAC_size(&tls_ctx->hmac_ctx));
    record_mac = &out[data_len];
  }

  // Perform the MAC check and the padding check in constant-time. It should be
  // safe to simply perform the padding check first, but it would not be under a
  // different choice of MAC location on padding failure. See
  // EVP_tls_cbc_remove_padding.
  crypto_word_t good =
      constant_time_eq_int(CRYPTO_memcmp(record_mac, mac, mac_len), 0);
  good &= padding_ok;
  CONSTTIME_DECLASSIFY(&good, sizeof(good));
  if (!good) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
    return 0;
  }

  CONSTTIME_DECLASSIFY(&data_len, sizeof(data_len));
  CONSTTIME_DECLASSIFY(out, data_len);

  // End of timing-sensitive code.

  *out_len = data_len;
  return 1;
}